

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O0

void __thiscall Game::Run(Game *this,Renderer *renderer,size_t target_frame_duration,int level)

{
  allocator<std::shared_ptr<Car>_> *this_00;
  initializer_list<std::shared_ptr<Car>_> __l;
  undefined4 y_00;
  bool bVar1;
  int iVar2;
  Uint32 UVar3;
  Car *pCVar4;
  element_type *peVar5;
  reference pOVar6;
  shared_ptr<Car> *local_3d8;
  thread *t_1;
  iterator __end1_3;
  iterator __begin1_3;
  vector<std::thread,_std::allocator<std::thread>_> *__range1_3;
  thread *t;
  iterator __end1_2;
  iterator __begin1_2;
  vector<std::thread,_std::allocator<std::thread>_> *__range1_2;
  Obstacle *o_2;
  iterator __end1_1;
  iterator __begin1_1;
  vector<Obstacle,_std::allocator<Obstacle>_> *__range1_1;
  code *local_320;
  undefined8 local_318;
  thread local_310;
  code *local_308;
  undefined8 local_300;
  thread local_2f8;
  reference local_2f0;
  thread *c;
  iterator __end4_1;
  iterator __begin4_1;
  vector<std::thread,_std::allocator<std::thread>_> *__range4_1;
  Obstacle *o_1;
  iterator __end4;
  iterator __begin4;
  vector<Obstacle,_std::allocator<Obstacle>_> *__range4;
  shared_ptr<Car> local_2a0;
  reference local_290;
  code *local_288;
  undefined8 local_280;
  thread local_278;
  reference local_270;
  Obstacle *o;
  iterator __end1;
  iterator __begin1;
  vector<Obstacle,_std::allocator<Obstacle>_> *__range1;
  vector<std::thread,_std::allocator<std::thread>_> obstacleThreads;
  string local_220;
  undefined1 local_200 [8];
  Obstacle obstacle;
  string local_1a0 [8];
  string direction;
  int d;
  int y;
  int x;
  int i;
  vector<Obstacle,_std::allocator<Obstacle>_> obstacles;
  undefined1 local_150 [32];
  shared_ptr<Car> local_130;
  undefined1 local_120 [8];
  vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_> carObjects;
  thread local_f8;
  code *local_f0;
  undefined8 local_e8;
  thread local_e0;
  undefined1 local_d8 [8];
  vector<std::thread,_std::allocator<std::thread>_> cars;
  string local_b8;
  undefined1 local_98 [8];
  shared_ptr<Car> car2;
  allocator<char> local_71;
  string local_70;
  undefined1 local_50 [8];
  shared_ptr<Car> car1;
  int local_38;
  bool running;
  int frame_count;
  Uint32 frame_duration;
  Uint32 frame_end;
  Uint32 frame_start;
  Uint32 title_timestamp;
  int level_local;
  size_t target_frame_duration_local;
  Renderer *renderer_local;
  Game *this_local;
  
  frame_end = SDL_GetTicks();
  local_38 = 0;
  car1.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = 1;
  pCVar4 = (Car *)operator_new(0x68);
  car2.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._3_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"horizontal",&local_71);
  Car::Car(pCVar4,0x1d6,0x1fe,0x280,-1,&local_70);
  car2.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._3_1_ = 0;
  std::shared_ptr<Car>::shared_ptr<Car,void>((shared_ptr<Car> *)local_50,pCVar4);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  pCVar4 = (Car *)operator_new(0x68);
  cars.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"vertical",
             (allocator<char> *)
             ((long)&cars.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  Car::Car(pCVar4,0x25d,0x203,0x280,-1,&local_b8);
  cars.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage._6_1_ = 0;
  std::shared_ptr<Car>::shared_ptr<Car,void>((shared_ptr<Car> *)local_98,pCVar4);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&cars.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)local_d8);
  local_f0 = Car::move;
  local_e8 = 0;
  std::thread::thread<void(Car::*)(),std::shared_ptr<Car>&,void>
            (&local_e0,(type *)&local_f0,(shared_ptr<Car> *)local_50);
  std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
            ((vector<std::thread,_std::allocator<std::thread>_> *)local_d8,&local_e0);
  std::thread::~thread(&local_e0);
  carObjects.super__Vector_base<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)Car::move;
  std::thread::thread<void(Car::*)(),std::shared_ptr<Car>&,void>
            (&local_f8,
             (type *)&carObjects.
                      super__Vector_base<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(shared_ptr<Car> *)local_98
            );
  std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
            ((vector<std::thread,_std::allocator<std::thread>_> *)local_d8,&local_f8);
  std::thread::~thread(&local_f8);
  std::shared_ptr<Car>::shared_ptr((shared_ptr<Car> *)local_150,(shared_ptr<Car> *)local_50);
  std::shared_ptr<Car>::shared_ptr
            ((shared_ptr<Car> *)(local_150 + 0x10),(shared_ptr<Car> *)local_98);
  local_130.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2;
  this_00 = (allocator<std::shared_ptr<Car>_> *)
            ((long)&obstacles.super__Vector_base<Obstacle,_std::allocator<Obstacle>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 7);
  local_130.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)local_150;
  std::allocator<std::shared_ptr<Car>_>::allocator(this_00);
  __l._M_len = (size_type)
               local_130.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  __l._M_array = (iterator)local_130.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_>::vector
            ((vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_> *)local_120,__l,
             this_00);
  std::allocator<std::shared_ptr<Car>_>::~allocator
            ((allocator<std::shared_ptr<Car>_> *)
             ((long)&obstacles.super__Vector_base<Obstacle,_std::allocator<Obstacle>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  local_3d8 = &local_130;
  do {
    local_3d8 = local_3d8 + -1;
    std::shared_ptr<Car>::~shared_ptr(local_3d8);
  } while (local_3d8 != (shared_ptr<Car> *)local_150);
  std::vector<Obstacle,_std::allocator<Obstacle>_>::vector
            ((vector<Obstacle,_std::allocator<Obstacle>_> *)&x);
  for (y = 0; SBORROW4(y,level * 3) != y + level * -3 < 0; y = y + 1) {
    iVar2 = Randomizer::genRand<int>(1,600);
    direction.field_2._12_4_ = Randomizer::genRand<int>(1,600);
    direction.field_2._8_4_ = Randomizer::genRand<int>(1,2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_1a0,"vertical",
               (allocator<char> *)
               ((long)&obstacle._cars.
                       super__Vector_base<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&obstacle._cars.
                       super__Vector_base<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    if (direction.field_2._8_4_ == 1) {
      std::__cxx11::string::operator=(local_1a0,"horizontal");
    }
    y_00 = direction.field_2._12_4_;
    std::__cxx11::string::string((string *)&local_220,local_1a0);
    std::vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_>::vector
              ((vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_> *)
               &obstacleThreads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,
               (vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_> *)local_120);
    Obstacle::Obstacle((Obstacle *)local_200,iVar2,y_00,600,1,&local_220,
                       (vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_> *)
                       &obstacleThreads.
                        super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    std::vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_>::~vector
              ((vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_> *)
               &obstacleThreads.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)&local_220);
    std::vector<Obstacle,_std::allocator<Obstacle>_>::emplace_back<Obstacle>
              ((vector<Obstacle,_std::allocator<Obstacle>_> *)&x,(Obstacle *)local_200);
    Obstacle::~Obstacle((Obstacle *)local_200);
    std::__cxx11::string::~string(local_1a0);
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)&__range1);
  __end1 = std::vector<Obstacle,_std::allocator<Obstacle>_>::begin
                     ((vector<Obstacle,_std::allocator<Obstacle>_> *)&x);
  o = (Obstacle *)
      std::vector<Obstacle,_std::allocator<Obstacle>_>::end
                ((vector<Obstacle,_std::allocator<Obstacle>_> *)&x);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Obstacle_*,_std::vector<Obstacle,_std::allocator<Obstacle>_>_>
                                     *)&o), bVar1) {
    local_290 = __gnu_cxx::
                __normal_iterator<Obstacle_*,_std::vector<Obstacle,_std::allocator<Obstacle>_>_>::
                operator*(&__end1);
    local_288 = Obstacle::move;
    local_280 = 0;
    local_270 = local_290;
    std::thread::thread<void(Obstacle::*)(),Obstacle*,void>
              (&local_278,(type *)&local_288,&local_290);
    std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
              ((vector<std::thread,_std::allocator<std::thread>_> *)&__range1,&local_278);
    std::thread::~thread(&local_278);
    __gnu_cxx::__normal_iterator<Obstacle_*,_std::vector<Obstacle,_std::allocator<Obstacle>_>_>::
    operator++(&__end1);
  }
  do {
    if ((car1.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ & 1) == 0)
    {
      __end1_1 = std::vector<Obstacle,_std::allocator<Obstacle>_>::begin
                           ((vector<Obstacle,_std::allocator<Obstacle>_> *)&x);
      o_2 = (Obstacle *)
            std::vector<Obstacle,_std::allocator<Obstacle>_>::end
                      ((vector<Obstacle,_std::allocator<Obstacle>_> *)&x);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end1_1,
                                (__normal_iterator<Obstacle_*,_std::vector<Obstacle,_std::allocator<Obstacle>_>_>
                                 *)&o_2), bVar1) {
        pOVar6 = __gnu_cxx::
                 __normal_iterator<Obstacle_*,_std::vector<Obstacle,_std::allocator<Obstacle>_>_>::
                 operator*(&__end1_1);
        Obstacle::deactivate(pOVar6);
        __gnu_cxx::__normal_iterator<Obstacle_*,_std::vector<Obstacle,_std::allocator<Obstacle>_>_>
        ::operator++(&__end1_1);
      }
      peVar5 = std::__shared_ptr_access<Car,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Car,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          local_50);
      Car::deactivate(peVar5);
      peVar5 = std::__shared_ptr_access<Car,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Car,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          local_98);
      Car::deactivate(peVar5);
      __end1_2 = std::vector<std::thread,_std::allocator<std::thread>_>::begin
                           ((vector<std::thread,_std::allocator<std::thread>_> *)local_d8);
      t = (thread *)
          std::vector<std::thread,_std::allocator<std::thread>_>::end
                    ((vector<std::thread,_std::allocator<std::thread>_> *)local_d8);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end1_2,
                                (__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                                 *)&t), bVar1) {
        __gnu_cxx::
        __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
        operator*(&__end1_2);
        std::thread::join();
        __gnu_cxx::
        __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
        operator++(&__end1_2);
      }
      __end1_3 = std::vector<std::thread,_std::allocator<std::thread>_>::begin
                           ((vector<std::thread,_std::allocator<std::thread>_> *)&__range1);
      t_1 = (thread *)
            std::vector<std::thread,_std::allocator<std::thread>_>::end
                      ((vector<std::thread,_std::allocator<std::thread>_> *)&__range1);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end1_3,
                                (__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                                 *)&t_1), bVar1) {
        __gnu_cxx::
        __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
        operator*(&__end1_3);
        std::thread::join();
        __gnu_cxx::
        __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
        operator++(&__end1_3);
      }
      std::vector<std::thread,_std::allocator<std::thread>_>::~vector
                ((vector<std::thread,_std::allocator<std::thread>_> *)&__range1);
      std::vector<Obstacle,_std::allocator<Obstacle>_>::~vector
                ((vector<Obstacle,_std::allocator<Obstacle>_> *)&x);
      std::vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_>::~vector
                ((vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_> *)local_120);
      std::vector<std::thread,_std::allocator<std::thread>_>::~vector
                ((vector<std::thread,_std::allocator<std::thread>_> *)local_d8);
      std::shared_ptr<Car>::~shared_ptr((shared_ptr<Car> *)local_98);
      std::shared_ptr<Car>::~shared_ptr((shared_ptr<Car> *)local_50);
      return;
    }
    iVar2 = SDL_GetTicks();
    std::shared_ptr<Car>::shared_ptr(&local_2a0,(shared_ptr<Car> *)local_50);
    std::shared_ptr<Car>::shared_ptr((shared_ptr<Car> *)&__range4,(shared_ptr<Car> *)local_98);
    Mycontroller::HandleInput
              ((bool *)((long)&car1.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                               _M_pi + 7),&local_2a0,(shared_ptr<Car> *)&__range4);
    std::shared_ptr<Car>::~shared_ptr((shared_ptr<Car> *)&__range4);
    std::shared_ptr<Car>::~shared_ptr(&local_2a0);
    peVar5 = std::__shared_ptr_access<Car,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Car,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_50);
    bVar1 = Car::isActive(peVar5);
    if (!bVar1) {
      peVar5 = std::__shared_ptr_access<Car,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Car,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          local_98);
      bVar1 = Car::isActive(peVar5);
      if (!bVar1) {
        peVar5 = std::__shared_ptr_access<Car,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                           ((__shared_ptr_access<Car,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                            local_50);
        bVar1 = Car::get_success(peVar5);
        if (bVar1) {
          peVar5 = std::__shared_ptr_access<Car,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->((__shared_ptr_access<Car,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                              local_98);
          bVar1 = Car::get_success(peVar5);
          if (bVar1) {
            car1.super___shared_ptr<Car,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = 0;
            this->score = this->score + 1;
            this->score = level * this->score;
            __end4 = std::vector<Obstacle,_std::allocator<Obstacle>_>::begin
                               ((vector<Obstacle,_std::allocator<Obstacle>_> *)&x);
            o_1 = (Obstacle *)
                  std::vector<Obstacle,_std::allocator<Obstacle>_>::end
                            ((vector<Obstacle,_std::allocator<Obstacle>_> *)&x);
            while (bVar1 = __gnu_cxx::operator!=
                                     (&__end4,(__normal_iterator<Obstacle_*,_std::vector<Obstacle,_std::allocator<Obstacle>_>_>
                                               *)&o_1), bVar1) {
              pOVar6 = __gnu_cxx::
                       __normal_iterator<Obstacle_*,_std::vector<Obstacle,_std::allocator<Obstacle>_>_>
                       ::operator*(&__end4);
              Obstacle::deactivate(pOVar6);
              __gnu_cxx::
              __normal_iterator<Obstacle_*,_std::vector<Obstacle,_std::allocator<Obstacle>_>_>::
              operator++(&__end4);
            }
            goto LAB_001057f6;
          }
        }
        __end4_1 = std::vector<std::thread,_std::allocator<std::thread>_>::begin
                             ((vector<std::thread,_std::allocator<std::thread>_> *)local_d8);
        c = (thread *)
            std::vector<std::thread,_std::allocator<std::thread>_>::end
                      ((vector<std::thread,_std::allocator<std::thread>_> *)local_d8);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end4_1,
                                  (__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                                   *)&c), bVar1) {
          local_2f0 = __gnu_cxx::
                      __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                      ::operator*(&__end4_1);
          std::thread::join();
          __gnu_cxx::
          __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
          ::operator++(&__end4_1);
        }
        peVar5 = std::__shared_ptr_access<Car,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                           ((__shared_ptr_access<Car,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                            local_50);
        Car::set_xpos(peVar5,500);
        peVar5 = std::__shared_ptr_access<Car,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                           ((__shared_ptr_access<Car,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                            local_50);
        Car::set_ypos(peVar5,500);
        peVar5 = std::__shared_ptr_access<Car,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                           ((__shared_ptr_access<Car,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                            local_98);
        Car::set_xpos(peVar5,0x1c2);
        peVar5 = std::__shared_ptr_access<Car,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                           ((__shared_ptr_access<Car,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                            local_98);
        Car::set_ypos(peVar5,600);
        peVar5 = std::__shared_ptr_access<Car,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                           ((__shared_ptr_access<Car,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                            local_50);
        Car::set_active(peVar5,true);
        peVar5 = std::__shared_ptr_access<Car,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                           ((__shared_ptr_access<Car,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                            local_98);
        Car::set_active(peVar5,true);
        std::vector<std::thread,_std::allocator<std::thread>_>::pop_back
                  ((vector<std::thread,_std::allocator<std::thread>_> *)local_d8);
        std::vector<std::thread,_std::allocator<std::thread>_>::pop_back
                  ((vector<std::thread,_std::allocator<std::thread>_> *)local_d8);
        local_308 = Car::move;
        local_300 = 0;
        std::thread::thread<void(Car::*)(),std::shared_ptr<Car>&,void>
                  (&local_2f8,(type *)&local_308,(shared_ptr<Car> *)local_50);
        std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                  ((vector<std::thread,_std::allocator<std::thread>_> *)local_d8,&local_2f8);
        std::thread::~thread(&local_2f8);
        local_320 = Car::move;
        local_318 = 0;
        std::thread::thread<void(Car::*)(),std::shared_ptr<Car>&,void>
                  (&local_310,(type *)&local_320,(shared_ptr<Car> *)local_98);
        std::vector<std::thread,_std::allocator<std::thread>_>::emplace_back<std::thread>
                  ((vector<std::thread,_std::allocator<std::thread>_> *)local_d8,&local_310);
        std::thread::~thread(&local_310);
      }
    }
LAB_001057f6:
    std::vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_>::vector
              ((vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_> *)&__range1_1,
               (vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_> *)local_120);
    Renderer::Render(renderer,(vector<Obstacle,_std::allocator<Obstacle>_> *)&x,
                     (vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_> *)
                     &__range1_1);
    std::vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_>::~vector
              ((vector<std::shared_ptr<Car>,_std::allocator<std::shared_ptr<Car>_>_> *)&__range1_1);
    UVar3 = SDL_GetTicks();
    local_38 = local_38 + 1;
    if (999 < UVar3 - frame_end) {
      Renderer::UpdateWindowTitle(renderer,this->score,local_38);
      local_38 = 0;
      frame_end = UVar3;
    }
    if (UVar3 - iVar2 < target_frame_duration) {
      title_timestamp = (Uint32)target_frame_duration;
      SDL_Delay(title_timestamp - (UVar3 - iVar2));
    }
  } while( true );
}

Assistant:

void Game::Run( Renderer &renderer,
               std::size_t target_frame_duration, int level) {
  Uint32 title_timestamp = SDL_GetTicks();
  Uint32 frame_start;
  Uint32 frame_end;
  Uint32 frame_duration;
  int frame_count = 0;
  bool running = true;


//---------Cars ---------------
  std::shared_ptr<Car> car1( new Car {470, 510, 640,-1, "horizontal"});
  std::shared_ptr<Car> car2 (new Car {605, 515, 640, -1, "vertical"});

  std::vector<std::thread> cars ;
  cars.emplace_back(std::thread(&Car::move, car1));
  cars.emplace_back(std::thread(&Car::move, car2));
  std::vector<std::shared_ptr<Car>> carObjects {car1,car2};
//-------------------------------



//--------Obstacles --------------
  std::vector<Obstacle> obstacles;

  for( int i = 0 ; i < level * 3; i++){
    int x = Randomizer::genRand(1,600);
    int y = Randomizer::genRand(1,600);
    int d = Randomizer::genRand(1,2);
    std::string direction = "vertical";

    if(d==1){
      direction = "horizontal";
    }
    //creating more obstacles (in every level)
    Obstacle obstacle {x,y, 600,1,direction,carObjects};
    obstacles.emplace_back(std::move(obstacle));
  }
  std::vector<std::thread> obstacleThreads;

  for ( auto& o : obstacles){
    obstacleThreads.emplace_back(std::thread(&Obstacle::move,&o));
  }
//-------------------------------



  while (running) {
    frame_start = SDL_GetTicks();

    // Input, [Update,] Render - the main game loop.
    //notice that the controller is automatically updating the object positions
    //so no need to create a method update()
    Mycontroller::HandleInput(running,car1,car2);

    
  // if cars are deactivated, then either reset or move to a new level
    if(car1->isActive()==false && car2->isActive() ==false){
       if(car1->get_success()==true && car2->get_success() ==true){
          running = false;
          score++;
          score *= level;
          for(auto& o : obstacles){
            o.deactivate();
          }
      }else{

      for(auto& c : cars){
        //std::cout <<"trying to join\n"<<std::endl;
        c.join();
        //std::cout <<"success  join\n"<<std::endl;
      }

      car1->set_xpos(500);
      car1->set_ypos(500);
      car2->set_xpos(450);
      car2->set_ypos(600);
      car1->set_active(true);
      car2->set_active(true);
       
      cars.pop_back();
      cars.pop_back();
       
      cars.emplace_back(std::thread(&Car::move, car1));
      cars.emplace_back(std::thread(&Car::move, car2));
      }

    }

    
    renderer.Render(obstacles, carObjects);

    frame_end = SDL_GetTicks();

    // Keep track of how long each loop through the input/update/render cycle
    // takes.
    frame_count++;
    frame_duration = frame_end - frame_start;

    // After every second, update the window title.
    if (frame_end - title_timestamp >= 1000) {
      renderer.UpdateWindowTitle(score, frame_count);
      frame_count = 0;
      title_timestamp = frame_end;
    }

    // If the time for this frame is too small (i.e. frame_duration is
    // smaller than the target ms_per_frame), delay the loop to
    // achieve the correct frame rate.
    if (frame_duration < target_frame_duration) {
      SDL_Delay(target_frame_duration - frame_duration);
    }
  }


// make sure that all threads will stop and join
  for(auto& o : obstacles){
    o.deactivate();
  }
  
  car1->deactivate();
  car2->deactivate();

for( auto& t : cars){
  t.join();
}

for(auto& t : obstacleThreads){
  t.join();
}
}